

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSharedPPData.cpp
# Opt level: O2

void __thiscall
SharedPPDataTest_testPropertyPointer_Test::SharedPPDataTest_testPropertyPointer_Test
          (SharedPPDataTest_testPropertyPointer_Test *this)

{
  SharedPPDataTest::SharedPPDataTest(&this->super_SharedPPDataTest);
  (this->super_SharedPPDataTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_007e94e0;
  return;
}

Assistant:

TEST_F(SharedPPDataTest, testPropertyPointer)
{
    int *i = new int;
    shared->AddProperty("test16",i);
    int* o;
    EXPECT_TRUE(shared->GetProperty("test16",o));
    EXPECT_EQ(i, o);
    shared->RemoveProperty("test16");
    EXPECT_FALSE(shared->GetProperty("test16",o));
}